

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr TIFFReadDirEntryCheckedSlong8(TIFF *tif,TIFFDirEntry *direntry,int64_t *value)

{
  TIFFReadDirEntryErr TVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint uVar3;
  undefined8 uStack_28;
  uint32_t offset;
  
  uVar2 = tif->tif_flags;
  if ((uVar2 >> 0x13 & 1) == 0) {
    uStack_28 = CONCAT44((direntry->tdir_offset).toff_long,(int)in_RAX);
    uVar3 = (direntry->tdir_offset).toff_long;
    if ((char)uVar2 < '\0') {
      TIFFSwabLong(&offset);
      uVar3 = offset;
    }
    TVar1 = TIFFReadDirEntryData(tif,(ulong)uVar3,8,value);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    uVar2 = tif->tif_flags;
  }
  else {
    *value = (int64_t)direntry->tdir_offset;
    uStack_28 = in_RAX;
  }
  if ((char)uVar2 < '\0') {
    TIFFSwabLong8((uint64_t *)value);
  }
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryCheckedSlong8(TIFF *tif, TIFFDirEntry *direntry, int64_t *value)
{
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        enum TIFFReadDirEntryErr err;
        uint32_t offset = direntry->tdir_offset.toff_long;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&offset);
        err = TIFFReadDirEntryData(tif, offset, 8, value);
        if (err != TIFFReadDirEntryErrOk)
            return (err);
    }
    else
        *value = *(int64_t *)(&direntry->tdir_offset);
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabLong8((uint64_t *)value);
    return (TIFFReadDirEntryErrOk);
}